

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void sorter_shell_sort(int64_t *dst,size_t size)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  int64_t *piVar7;
  int64_t *piVar8;
  ulong uVar9;
  
  if (size < 2) {
    return;
  }
  if (size < 0xa0c4cb00abb15e9c) {
    lVar2 = 0x2f00000000;
    puVar6 = shell_gaps + 0x2e;
    do {
      lVar2 = lVar2 + -0x100000000;
      uVar3 = *puVar6;
      puVar6 = puVar6 + -1;
    } while (size >> 1 < uVar3);
    lVar2 = lVar2 >> 0x20;
  }
  else {
    uVar3 = 0x5062658055d8af4e;
    lVar2 = 0x2f;
  }
  do {
    if (uVar3 < size) {
      piVar7 = dst + uVar3;
      piVar8 = dst;
      uVar9 = uVar3;
      do {
        lVar1 = dst[uVar9];
        uVar5 = uVar9;
        if (uVar3 <= uVar9) {
          lVar4 = 0;
          do {
            if (piVar8[lVar4] <= lVar1) {
              uVar5 = lVar4 + uVar9;
              break;
            }
            piVar7[lVar4] = piVar8[lVar4];
            lVar4 = lVar4 - uVar3;
            uVar5 = uVar9 + lVar4;
          } while (uVar3 <= uVar5);
        }
        dst[uVar5] = lVar1;
        uVar9 = uVar9 + 1;
        piVar7 = piVar7 + 1;
        piVar8 = piVar8 + 1;
      } while (uVar9 != size);
    }
    if (uVar3 == 1) {
      return;
    }
    uVar3 = *(ulong *)(&UINT_0011b0e8 + lVar2 * 2);
    lVar2 = lVar2 + -1;
  } while( true );
}

Assistant:

void SHELL_SORT(SORT_TYPE *dst, const size_t size) {
  /* don't bother sorting an array of size 0 or 1 */
  /* TODO: binary search to find first gap? */
  int inci = 47;
  size_t inc = shell_gaps[inci];
  size_t i;

  if (size <= 1) {
    return;
  }

  while (inc > (size >> 1)) {
    inc = shell_gaps[--inci];
  }

  while (1) {
    for (i = inc; i < size; i++) {
      SORT_TYPE temp = dst[i];
      size_t j = i;

      while ((j >= inc) && (SORT_CMP(dst[j - inc], temp) > 0)) {
        dst[j] = dst[j - inc];
        j -= inc;
      }

      dst[j] = temp;
    }

    if (inc == 1) {
      break;
    }

    inc = shell_gaps[--inci];
  }
}